

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_initgamedialog.cpp
# Opt level: O0

void InitGameDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  int *result;
  QString local_58;
  QString local_40;
  QObject *local_28;
  InitGameDialog *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      local_28 = _o;
      _t = (InitGameDialog *)_a;
      _a_local._0_4_ = _id;
      _a_local._4_4_ = _c;
      __id_local = _o;
      QString::QString(&local_40,(QString *)_a[1]);
      QString::QString(&local_58,*(QString **)&_t->field_0x10);
      sendPlayerNames((InitGameDialog *)_o,&local_40,&local_58);
      QString::~QString(&local_58);
      QString::~QString(&local_40);
    }
  }
  else if ((_c == IndexOfMethod) &&
          (pcVar1 = *_a[1],
          pcVar1 == sendPlayerNames && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)))
  {
    *(undefined4 *)*_a = 0;
  }
  return;
}

Assistant:

void InitGameDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<InitGameDialog *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->sendPlayerNames((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (InitGameDialog::*)(QString , QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InitGameDialog::sendPlayerNames)) {
                *result = 0;
                return;
            }
        }
    }
}